

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall preciseUnitOps_nan_Test::~preciseUnitOps_nan_Test(preciseUnitOps_nan_Test *this)

{
  preciseUnitOps_nan_Test *this_local;
  
  ~preciseUnitOps_nan_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseUnitOps, nan)
{
    EXPECT_TRUE(isnan(precise::invalid));
    EXPECT_FALSE(isnan(precise::defunit));
    auto zunit = precise_unit(0.0, m);
    auto zunit2 = precise_unit(0.0, kg);
    auto nunit = zunit2 / zunit;
    EXPECT_TRUE(isnan(nunit));

    EXPECT_TRUE(isnan(precise_unit(invalid)));
}